

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall QLocale::QLocale(QLocale *this)

{
  Type *o;
  
  (this->d).d.ptr = (QLocalePrivate *)&c_private()::c_locale;
  LOCK();
  _DAT_00679228 = _DAT_00679228 + 1;
  UNLOCK();
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>::guard.
            _q_value.super___atomic_base<signed_char>._M_i < -1) {
    return;
  }
  systemData((qsizetype *)0x0);
  o = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>::
      instance();
  QSharedDataPointer<QLocalePrivate>::operator=(&this->d,o);
  return;
}

Assistant:

explicit constexpr totally_ordered_wrapper(P p) noexcept : ptr(p) {}